

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_set_stream_user_data
              (nghttp2_session *session,int32_t stream_id,void *stream_user_data)

{
  nghttp2_outbound_item *pnVar1;
  int iVar2;
  nghttp2_stream *pnVar3;
  void *in_RDX;
  uint in_ESI;
  nghttp2_session *in_RDI;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_stream *stream;
  nghttp2_outbound_item *local_38;
  undefined8 in_stack_ffffffffffffffd0;
  nghttp2_session *in_stack_ffffffffffffffd8;
  int local_4;
  
  pnVar3 = nghttp2_session_get_stream
                     (in_stack_ffffffffffffffd8,(int32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20))
  ;
  if (pnVar3 == (nghttp2_stream *)0x0) {
    if (((in_RDI->server == '\0') &&
        (iVar2 = nghttp2_session_is_my_stream_id(in_RDI,in_ESI), iVar2 != 0)) &&
       ((in_RDI->ob_syn).head != (nghttp2_outbound_item *)0x0)) {
      pnVar1 = (in_RDI->ob_syn).head;
      if ((pnVar1->frame).hd.type != '\x01') {
        __assert_fail("frame->hd.type == NGHTTP2_HEADERS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                      ,0x1ebc,
                      "int nghttp2_session_set_stream_user_data(nghttp2_session *, int32_t, void *)"
                     );
      }
      if (((int)in_ESI < (pnVar1->frame).hd.stream_id) || (in_RDI->next_stream_id <= in_ESI)) {
        local_4 = -0x1f5;
      }
      else {
        for (local_38 = (in_RDI->ob_syn).head; local_38 != (nghttp2_outbound_item *)0x0;
            local_38 = local_38->qnext) {
          if ((int)in_ESI <= (local_38->frame).hd.stream_id) {
            if ((local_38->frame).hd.stream_id <= (int)in_ESI) {
              (local_38->aux_data).headers.stream_user_data = in_RDX;
              return 0;
            }
            break;
          }
        }
        local_4 = -0x1f5;
      }
    }
    else {
      local_4 = -0x1f5;
    }
  }
  else {
    pnVar3->stream_user_data = in_RDX;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nghttp2_session_set_stream_user_data(nghttp2_session *session,
                                         int32_t stream_id,
                                         void *stream_user_data) {
  nghttp2_stream *stream;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;

  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream) {
    stream->stream_user_data = stream_user_data;
    return 0;
  }

  if (session->server || !nghttp2_session_is_my_stream_id(session, stream_id) ||
      !nghttp2_outbound_queue_top(&session->ob_syn)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  frame = &nghttp2_outbound_queue_top(&session->ob_syn)->frame;
  assert(frame->hd.type == NGHTTP2_HEADERS);

  if (frame->hd.stream_id > stream_id ||
      (uint32_t)stream_id >= session->next_stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  for (item = session->ob_syn.head; item; item = item->qnext) {
    if (item->frame.hd.stream_id < stream_id) {
      continue;
    }

    if (item->frame.hd.stream_id > stream_id) {
      break;
    }

    item->aux_data.headers.stream_user_data = stream_user_data;
    return 0;
  }

  return NGHTTP2_ERR_INVALID_ARGUMENT;
}